

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadSplat
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  Literal *pLVar2;
  Literal local_f8;
  undefined4 local_e0;
  undefined1 local_d0 [8];
  Flow flow;
  code *local_80;
  offset_in_Literal_to_subr splat;
  Type local_70;
  undefined1 local_68 [8];
  Load load;
  SIMDLoad *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  load.memory.super_IString.str._M_str = (char *)curr;
  Load::Load((Load *)local_68);
  Name::operator=((Name *)&load.ptr,(Name *)(load.memory.super_IString.str._M_str + 0x30));
  Type::Type(&local_70,i32);
  load.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._0_8_ = local_70.id;
  load.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id._0_1_ =
       ::wasm::SIMDLoad::getMemBytes();
  load.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id._1_1_ = 0;
  load.bytes = load.memory.super_IString.str._M_str[0x18];
  load.signed_ = (bool)load.memory.super_IString.str._M_str[0x19];
  load._18_1_ = load.memory.super_IString.str._M_str[0x1a];
  load._19_1_ = load.memory.super_IString.str._M_str[0x1b];
  load._20_1_ = load.memory.super_IString.str._M_str[0x1c];
  load._21_1_ = load.memory.super_IString.str._M_str[0x1d];
  load._22_1_ = load.memory.super_IString.str._M_str[0x1e];
  load._23_1_ = load.memory.super_IString.str._M_str[0x1f];
  load.offset.addr = *(address64_t *)(load.memory.super_IString.str._M_str + 0x20);
  load.align.addr._0_1_ = 0;
  load.isAtomic = (bool)load.memory.super_IString.str._M_str[0x28];
  load._41_1_ = load.memory.super_IString.str._M_str[0x29];
  load._42_1_ = load.memory.super_IString.str._M_str[0x2a];
  load._43_1_ = load.memory.super_IString.str._M_str[0x2b];
  load._44_1_ = load.memory.super_IString.str._M_str[0x2c];
  load._45_1_ = load.memory.super_IString.str._M_str[0x2d];
  load._46_1_ = load.memory.super_IString.str._M_str[0x2e];
  load._47_1_ = load.memory.super_IString.str._M_str[0x2f];
  switch(*(undefined4 *)(load.memory.super_IString.str._M_str + 0x10)) {
  case 0:
    local_80 = ::wasm::Literal::splatI8x16;
    break;
  case 1:
    local_80 = ::wasm::Literal::splatI16x8;
    break;
  case 2:
    local_80 = ::wasm::Literal::splatI32x4;
    break;
  case 3:
    Type::Type((Type *)&flow.breakTo.super_IString.str._M_str,i64);
    load.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._0_8_ =
         flow.breakTo.super_IString.str._M_str;
    local_80 = ::wasm::Literal::splatI64x2;
    break;
  default:
    ::wasm::handle_unreachable
              ("invalid op",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
               ,0xc97);
  }
  ::wasm::Load::finalize();
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit((Flow *)local_d0,this_00,(Expression *)local_68);
  bVar1 = Flow::breaking((Flow *)local_d0);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_d0);
  }
  else {
    pLVar2 = Flow::getSingleValue((Flow *)local_d0);
    (*local_80)(&local_f8,pLVar2);
    Flow::Flow(__return_storage_ptr__,&local_f8);
    ::wasm::Literal::~Literal(&local_f8);
  }
  local_e0 = 1;
  Flow::~Flow((Flow *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadSplat(SIMDLoad* curr) {
    Load load;
    load.memory = curr->memory;
    load.type = Type::i32;
    load.bytes = curr->getMemBytes();
    load.signed_ = false;
    load.offset = curr->offset;
    load.align = curr->align;
    load.isAtomic = false;
    load.ptr = curr->ptr;
    Literal (Literal::*splat)() const = nullptr;
    switch (curr->op) {
      case Load8SplatVec128:
        splat = &Literal::splatI8x16;
        break;
      case Load16SplatVec128:
        splat = &Literal::splatI16x8;
        break;
      case Load32SplatVec128:
        splat = &Literal::splatI32x4;
        break;
      case Load64SplatVec128:
        load.type = Type::i64;
        splat = &Literal::splatI64x2;
        break;
      default:
        WASM_UNREACHABLE("invalid op");
    }
    load.finalize();
    Flow flow = self()->visit(&load);
    if (flow.breaking()) {
      return flow;
    }
    return (flow.getSingleValue().*splat)();
  }